

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::Swap
          (DescriptorProto_ExtensionRange *this,DescriptorProto_ExtensionRange *other)

{
  DescriptorProto_ExtensionRange *other_local;
  DescriptorProto_ExtensionRange *this_local;
  
  if (other != this) {
    std::swap<int>(&this->start_,&other->start_);
    std::swap<int>(&this->end_,&other->end_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::Swap(DescriptorProto_ExtensionRange* other) {
  if (other != this) {
    std::swap(start_, other->start_);
    std::swap(end_, other->end_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}